

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cpp
# Opt level: O2

RWNode * __thiscall
dg::dda::LLVMReadWriteGraphBuilder::createRealloc(LLVMReadWriteGraphBuilder *this,Instruction *Inst)

{
  RWNode *this_00;
  Use *pUVar1;
  uint64_t uVar2;
  uint64_t size;
  Offset local_30;
  Offset local_28;
  
  this_00 = ReadWriteGraph::create(&this->graph,DYN_ALLOC);
  pUVar1 = llvm::User::getOperandList((User *)Inst);
  uVar2 = llvmutils::getConstantValue(*(Value **)(pUVar1 + 0x20));
  size = Offset::UNKNOWN;
  if (uVar2 != 0) {
    (this_00->super_SubgraphNode<dg::dda::RWNode>).size = uVar2;
    size = uVar2;
  }
  local_28.offset = 0;
  local_30.offset = size;
  RWNode::addDef(this_00,this_00,&local_28,&local_30,false);
  if (this->buildUses == true) {
    addReallocUses(this,Inst,this_00,size);
  }
  return this_00;
}

Assistant:

RWNode *
LLVMReadWriteGraphBuilder::createRealloc(const llvm::Instruction *Inst) {
    RWNode &node = create(RWNodeType::DYN_ALLOC);

    uint64_t size = llvmutils::getConstantValue(Inst->getOperand(1));
    if (size == 0)
        size = Offset::UNKNOWN;
    else
        node.setSize(size);

    // realloc defines itself, since it copies the values
    // from previous memory
    node.addDef(&node, 0, size, false /* strong update */);

    if (buildUses) {
        // realloc copies the memory
        // NOTE: do not use mapPointers, it could lead to infinite
        // recursion as realloc may use itself and the 'node' is not
        // in the map yet
        addReallocUses(Inst, node, size);
    }
    return &node;
}